

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgConvexHull3d.cpp
# Opt level: O1

dgAABBPointTree3d * __thiscall
dgConvexHull3d::BuildTree
          (dgConvexHull3d *this,dgAABBPointTree3d *parent,dgHullVertex *points,HaI32 count,
          HaI32 baseIndex,HaI8 **memoryPool,HaI32 *maxMemSize)

{
  dgHullVertex *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double *pdVar6;
  dgAABBPointTree3d *pdVar7;
  uint uVar8;
  uint count_00;
  long lVar9;
  HaI32 i;
  int i_00;
  dgHullVertex *pdVar10;
  dgAABBPointTree3d *parent_00;
  HaI32 i_01;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  double dVar15;
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double local_f8;
  dgTemplateVector<double> local_98;
  dgTemplateVector<double> local_78;
  double local_58;
  double dStack_50;
  double dStack_48;
  double dStack_40;
  undefined8 local_38;
  
  if (count == 0) {
    __assert_fail("count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                  ,0xaf,
                  "dgAABBPointTree3d *dgConvexHull3d::BuildTree(dgAABBPointTree3d *const, dgHullVertex *const, hacd::HaI32, hacd::HaI32, hacd::HaI8 **, hacd::HaI32 &) const"
                 );
  }
  if (count < 9) {
    parent_00 = (dgAABBPointTree3d *)*memoryPool;
    *memoryPool = (HaI8 *)&parent_00[1].m_box[1].super_dgTemplateVector<double>.m_y;
    *maxMemSize = *maxMemSize + -0x80;
    if (*maxMemSize < 0) {
      __assert_fail("maxMemSize >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                    ,0xb7,
                    "dgAABBPointTree3d *dgConvexHull3d::BuildTree(dgAABBPointTree3d *const, dgHullVertex *const, hacd::HaI32, hacd::HaI32, hacd::HaI8 **, hacd::HaI32 &) const"
                   );
    }
    *(HaI32 *)&parent_00[1].m_box[0].super_dgTemplateVector<double>.m_x = count;
    if (count < 1) {
      dVar31 = 999999986991104.0;
      dVar29 = -999999986991104.0;
      dVar28 = -999999986991104.0;
      dVar26 = -999999986991104.0;
      dVar32 = 999999986991104.0;
      dVar30 = 999999986991104.0;
    }
    else {
      pdVar6 = &(points->super_dgBigVector).super_dgTemplateVector<double>.m_z;
      auVar22 = ZEXT816(0xc30c6bf520000000);
      auVar27 = ZEXT816(0x430c6bf520000000);
      uVar11 = 0;
      auVar3 = auVar22;
      auVar2 = auVar22;
      auVar4 = auVar27;
      auVar5 = auVar27;
      do {
        *(HaI32 *)((long)&parent_00[1].m_box[0].super_dgTemplateVector<double>.m_x + uVar11 * 4 + 4)
             = baseIndex + (int)uVar11;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = ((dgTemplateVector<double> *)(pdVar6 + -2))->m_x;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = pdVar6[-1];
        auVar4 = vminsd_avx(auVar4,auVar16);
        dVar31 = auVar4._0_8_;
        auVar5 = vminsd_avx(auVar5,auVar18);
        dVar32 = auVar5._0_8_;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = *pdVar6;
        auVar27 = vminsd_avx(auVar27,auVar20);
        dVar30 = auVar27._0_8_;
        auVar2 = vmaxsd_avx(auVar2,auVar16);
        dVar29 = auVar2._0_8_;
        auVar3 = vmaxsd_avx(auVar3,auVar18);
        dVar28 = auVar3._0_8_;
        auVar22 = vmaxsd_avx(auVar22,auVar20);
        dVar26 = auVar22._0_8_;
        uVar11 = uVar11 + 1;
        pdVar6 = pdVar6 + 5;
      } while ((uint)count != uVar11);
    }
    parent_00->m_left = (dgAABBPointTree3d *)0x0;
    parent_00->m_right = (dgAABBPointTree3d *)0x0;
  }
  else {
    local_98.m_w = 0.0;
    dVar33 = 0.0;
    auVar22 = ZEXT816(0xc30c6bf520000000);
    auVar27 = ZEXT816(0x430c6bf520000000);
    lVar9 = 0;
    dVar34 = 0.0;
    dVar35 = 0.0;
    dVar15 = 0.0;
    dVar17 = 0.0;
    dVar19 = 0.0;
    auVar4 = auVar27;
    auVar5 = auVar27;
    auVar3 = auVar22;
    auVar2 = auVar22;
    do {
      dVar21 = *(double *)
                ((long)&(points->super_dgBigVector).super_dgTemplateVector<double>.m_x + lVar9);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = dVar21;
      dVar26 = *(double *)
                ((long)&(points->super_dgBigVector).super_dgTemplateVector<double>.m_y + lVar9);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = dVar26;
      auVar4 = vminsd_avx(auVar4,auVar23);
      auVar5 = vminsd_avx(auVar5,auVar24);
      dVar28 = *(double *)
                ((long)&(points->super_dgBigVector).super_dgTemplateVector<double>.m_z + lVar9);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dVar28;
      auVar27 = vminsd_avx(auVar27,auVar25);
      auVar2 = vmaxsd_avx(auVar2,auVar23);
      auVar3 = vmaxsd_avx(auVar3,auVar24);
      auVar22 = vmaxsd_avx(auVar22,auVar25);
      dVar35 = dVar35 + dVar21;
      dVar34 = dVar34 + dVar26;
      dVar33 = dVar33 + dVar28;
      dVar15 = dVar21 * dVar21 + dVar15;
      dVar17 = dVar26 * dVar26 + dVar17;
      dVar19 = dVar28 * dVar28 + dVar19;
      lVar9 = lVar9 + 0x28;
    } while ((ulong)(uint)count * 0x28 != lVar9);
    dVar32 = auVar5._0_8_;
    dVar31 = auVar4._0_8_;
    dVar30 = auVar27._0_8_;
    dVar29 = auVar2._0_8_;
    dVar28 = auVar3._0_8_;
    dVar26 = auVar22._0_8_;
    dVar21 = (double)count;
    local_98.m_x = dVar15 * dVar21 - dVar35 * dVar35;
    local_98.m_y = dVar17 * dVar21 - dVar34 * dVar34;
    local_98.m_z = dVar19 * dVar21 - dVar33 * dVar33;
    if (((0x7fefffffffffffff < (long)ABS(local_98.m_x)) ||
        (0x7fefffffffffffff < (long)ABS(local_98.m_y))) ||
       (0x7fefffffffffffff < (long)ABS(local_98.m_z))) goto LAB_00871cd2;
    local_98.m_w = 0.0;
    local_f8 = -10000000000.0;
    i_00 = 0;
    i_01 = 0;
    do {
      pdVar6 = dgTemplateVector<double>::operator[](&local_98,i_00);
      if (local_f8 < *pdVar6) {
        pdVar6 = dgTemplateVector<double>::operator[](&local_98,i_00);
        local_f8 = *pdVar6;
        i_01 = i_00;
      }
      i_00 = i_00 + 1;
    } while (i_00 != 3);
    local_78.m_z = 1.0 / (double)count;
    local_78.m_x = local_78.m_z * dVar35;
    local_78.m_y = local_78.m_z * dVar34;
    local_78.m_z = local_78.m_z * dVar33;
    local_78.m_w = 0.0;
    dVar15 = local_98.m_x;
    dVar17 = local_98.m_y;
    dVar19 = local_98.m_z;
    if (((0x7fefffffffffffff < (long)ABS(local_78.m_x)) ||
        (0x7fefffffffffffff < (long)ABS(local_78.m_y))) ||
       (0x7fefffffffffffff < (long)ABS(local_78.m_z))) goto LAB_00871cd2;
    pdVar6 = dgTemplateVector<double>::operator[](&local_78,i_01);
    dVar35 = *pdVar6;
    count_00 = 0;
    uVar12 = count - 1U;
    do {
      uVar11 = (ulong)(int)uVar12;
      uVar8 = count_00;
      if ((int)count_00 <= (int)uVar12) {
        uVar8 = uVar12 + 1;
        pdVar10 = points + (int)count_00;
        lVar9 = 0;
        do {
          pdVar6 = dgTemplateVector<double>::operator[]((dgTemplateVector<double> *)pdVar10,i_01);
          if (dVar35 < *pdVar6) {
            uVar8 = count_00 - (int)lVar9;
            break;
          }
          lVar9 = lVar9 + -1;
          pdVar10 = pdVar10 + 1;
        } while (~uVar11 + (long)(int)count_00 != lVar9);
      }
      lVar9 = (long)(int)uVar8;
      uVar13 = uVar12;
      if ((int)uVar8 <= (int)uVar12) {
        lVar14 = uVar11 + 1;
        pdVar10 = points + uVar11;
        do {
          pdVar6 = dgTemplateVector<double>::operator[]((dgTemplateVector<double> *)pdVar10,i_01);
          uVar13 = uVar12;
          if (*pdVar6 < dVar35) break;
          uVar12 = uVar12 - 1;
          lVar14 = lVar14 + -1;
          pdVar10 = pdVar10 + -1;
          uVar13 = uVar8 - 1;
        } while (lVar9 < lVar14);
      }
      uVar12 = uVar13;
      count_00 = uVar8;
      if ((int)uVar8 < (int)uVar13) {
        local_38 = *(undefined8 *)&points[lVar9].m_index;
        pdVar10 = points + lVar9;
        local_58 = (pdVar10->super_dgBigVector).super_dgTemplateVector<double>.m_x;
        dStack_50 = (pdVar10->super_dgBigVector).super_dgTemplateVector<double>.m_y;
        dStack_48 = (pdVar10->super_dgBigVector).super_dgTemplateVector<double>.m_z;
        dStack_40 = (pdVar10->super_dgBigVector).super_dgTemplateVector<double>.m_w;
        points[lVar9].m_index = points[(int)uVar13].m_index;
        pdVar10 = points + (int)uVar13;
        dVar34 = (pdVar10->super_dgBigVector).super_dgTemplateVector<double>.m_y;
        dVar33 = (pdVar10->super_dgBigVector).super_dgTemplateVector<double>.m_z;
        dVar15 = (pdVar10->super_dgBigVector).super_dgTemplateVector<double>.m_w;
        pdVar1 = points + lVar9;
        (pdVar1->super_dgBigVector).super_dgTemplateVector<double>.m_x =
             (pdVar10->super_dgBigVector).super_dgTemplateVector<double>.m_x;
        (pdVar1->super_dgBigVector).super_dgTemplateVector<double>.m_y = dVar34;
        (pdVar1->super_dgBigVector).super_dgTemplateVector<double>.m_z = dVar33;
        (pdVar1->super_dgBigVector).super_dgTemplateVector<double>.m_w = dVar15;
        points[(int)uVar13].m_index = (HaI32)local_38;
        pdVar10 = points + (int)uVar13;
        (pdVar10->super_dgBigVector).super_dgTemplateVector<double>.m_x = local_58;
        (pdVar10->super_dgBigVector).super_dgTemplateVector<double>.m_y = dStack_50;
        (pdVar10->super_dgBigVector).super_dgTemplateVector<double>.m_z = dStack_48;
        (pdVar10->super_dgBigVector).super_dgTemplateVector<double>.m_w = dStack_40;
        count_00 = uVar8 + 1;
        uVar12 = uVar13 - 1;
      }
    } while ((int)count_00 <= (int)uVar12);
    if (count_00 == 0) {
      count_00 = (uint)count >> 1;
    }
    if (count_00 == count - 1U) {
      count_00 = (uint)count >> 1;
    }
    parent_00 = (dgAABBPointTree3d *)*memoryPool;
    *memoryPool = (HaI8 *)(parent_00 + 1);
    *maxMemSize = *maxMemSize + -0x58;
    if (*maxMemSize < 0) {
      __assert_fail("maxMemSize >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                    ,0x10d,
                    "dgAABBPointTree3d *dgConvexHull3d::BuildTree(dgAABBPointTree3d *const, dgHullVertex *const, hacd::HaI32, hacd::HaI32, hacd::HaI8 **, hacd::HaI32 &) const"
                   );
    }
    if (count_00 == 0) {
      __assert_fail("i0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                    ,0x10f,
                    "dgAABBPointTree3d *dgConvexHull3d::BuildTree(dgAABBPointTree3d *const, dgHullVertex *const, hacd::HaI32, hacd::HaI32, hacd::HaI8 **, hacd::HaI32 &) const"
                   );
    }
    if (count - count_00 == 0) {
      __assert_fail("count - i0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                    ,0x110,
                    "dgAABBPointTree3d *dgConvexHull3d::BuildTree(dgAABBPointTree3d *const, dgHullVertex *const, hacd::HaI32, hacd::HaI32, hacd::HaI8 **, hacd::HaI32 &) const"
                   );
    }
    pdVar7 = BuildTree(this,parent_00,points,count_00,baseIndex,memoryPool,maxMemSize);
    parent_00->m_left = pdVar7;
    pdVar7 = BuildTree(this,parent_00,points + (int)count_00,count - count_00,count_00 + baseIndex,
                       memoryPool,maxMemSize);
    parent_00->m_right = pdVar7;
  }
  parent_00->m_parent = parent;
  dVar15 = local_98.m_x;
  dVar17 = local_98.m_y;
  dVar19 = local_98.m_z;
  if ((((long)ABS(dVar31 + -0.0010000000474974513) < 0x7ff0000000000000) &&
      ((long)ABS(dVar32 + -0.0010000000474974513) < 0x7ff0000000000000)) &&
     ((long)ABS(dVar30 + -0.0010000000474974513) < 0x7ff0000000000000)) {
    parent_00->m_box[0].super_dgTemplateVector<double>.m_x = dVar31 + -0.0010000000474974513;
    parent_00->m_box[0].super_dgTemplateVector<double>.m_y = dVar32 + -0.0010000000474974513;
    parent_00->m_box[0].super_dgTemplateVector<double>.m_z = dVar30 + -0.0010000000474974513;
    parent_00->m_box[0].super_dgTemplateVector<double>.m_w = 0.0;
    if ((((long)ABS(dVar29 + 0.0010000000474974513) < 0x7ff0000000000000) &&
        ((long)ABS(dVar28 + 0.0010000000474974513) < 0x7ff0000000000000)) &&
       ((long)ABS(dVar26 + 0.0010000000474974513) < 0x7ff0000000000000)) {
      parent_00->m_box[1].super_dgTemplateVector<double>.m_x = dVar29 + 0.0010000000474974513;
      parent_00->m_box[1].super_dgTemplateVector<double>.m_y = dVar28 + 0.0010000000474974513;
      parent_00->m_box[1].super_dgTemplateVector<double>.m_z = dVar26 + 0.0010000000474974513;
      parent_00->m_box[1].super_dgTemplateVector<double>.m_w = 0.0;
      return parent_00;
    }
  }
LAB_00871cd2:
  local_98.m_z = dVar19;
  local_98.m_y = dVar17;
  local_98.m_x = dVar15;
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x145,"dgBigVector::dgBigVector(const dgTemplateVector<hacd::HaF64> &)");
}

Assistant:

dgAABBPointTree3d* dgConvexHull3d::BuildTree (dgAABBPointTree3d* const parent, dgHullVertex* const points, hacd::HaI32 count, hacd::HaI32 baseIndex, hacd::HaI8** memoryPool, hacd::HaI32& maxMemSize) const
{
	dgAABBPointTree3d* tree = NULL;

	HACD_ASSERT (count);
	dgBigVector minP ( hacd::HaF32 (1.0e15f),  hacd::HaF32 (1.0e15f),  hacd::HaF32 (1.0e15f), hacd::HaF32 (0.0f)); 
	dgBigVector maxP (-hacd::HaF32 (1.0e15f), -hacd::HaF32 (1.0e15f), -hacd::HaF32 (1.0e15f), hacd::HaF32 (0.0f)); 
	if (count <= DG_VERTEX_CLUMP_SIZE_3D) {

		dgAABBPointTree3dClump* const clump = new (*memoryPool) dgAABBPointTree3dClump;
		*memoryPool += sizeof (dgAABBPointTree3dClump);
		maxMemSize -= sizeof (dgAABBPointTree3dClump);
		HACD_ASSERT (maxMemSize >= 0);


		clump->m_count = count;
		for (hacd::HaI32 i = 0; i < count; i ++) {
			clump->m_indices[i] = i + baseIndex;

			const dgBigVector& p = points[i];
			minP.m_x = GetMin (p.m_x, minP.m_x); 
			minP.m_y = GetMin (p.m_y, minP.m_y); 
			minP.m_z = GetMin (p.m_z, minP.m_z); 

			maxP.m_x = GetMax (p.m_x, maxP.m_x); 
			maxP.m_y = GetMax (p.m_y, maxP.m_y); 
			maxP.m_z = GetMax (p.m_z, maxP.m_z); 
		}

		clump->m_left = NULL;
		clump->m_right = NULL;
		tree = clump;

	} else {
		dgBigVector median (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
		dgBigVector varian (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
		for (hacd::HaI32 i = 0; i < count; i ++) {

			const dgBigVector& p = points[i];
			minP.m_x = GetMin (p.m_x, minP.m_x); 
			minP.m_y = GetMin (p.m_y, minP.m_y); 
			minP.m_z = GetMin (p.m_z, minP.m_z); 

			maxP.m_x = GetMax (p.m_x, maxP.m_x); 
			maxP.m_y = GetMax (p.m_y, maxP.m_y); 
			maxP.m_z = GetMax (p.m_z, maxP.m_z); 

			median += p;
			varian += p.CompProduct (p);
		}

		varian = varian.Scale (hacd::HaF32 (count)) - median.CompProduct(median);
		hacd::HaI32 index = 0;
		hacd::HaF64 maxVarian = hacd::HaF64 (-1.0e10f);
		for (hacd::HaI32 i = 0; i < 3; i ++) {
			if (varian[i] > maxVarian) {
				index = i;
				maxVarian = varian[i];
			}
		}
		dgBigVector center = median.Scale (hacd::HaF64 (1.0f) / hacd::HaF64 (count));

		hacd::HaF64 test = center[index];

		hacd::HaI32 i0 = 0;
		hacd::HaI32 i1 = count - 1;
		do {    
			for (; i0 <= i1; i0 ++) {
				hacd::HaF64 val = points[i0][index];
				if (val > test) {
					break;
				}
			}

			for (; i1 >= i0; i1 --) {
				hacd::HaF64 val = points[i1][index];
				if (val < test) {
					break;
				}
			}

			if (i0 < i1)	{
				Swap(points[i0], points[i1]);
				i0++; 
				i1--;
			}
		} while (i0 <= i1);

		if (i0 == 0){
			i0 = count / 2;
		}
		if (i0 == (count - 1)){
			i0 = count / 2;
		}

		tree = new (*memoryPool) dgAABBPointTree3d;
		*memoryPool += sizeof (dgAABBPointTree3d);
		maxMemSize -= sizeof (dgAABBPointTree3d);
		HACD_ASSERT (maxMemSize >= 0);

		HACD_ASSERT (i0);
		HACD_ASSERT (count - i0);

		tree->m_left = BuildTree (tree, points, i0, baseIndex, memoryPool, maxMemSize);
		tree->m_right = BuildTree (tree, &points[i0], count - i0, i0 + baseIndex, memoryPool, maxMemSize);
	}

	HACD_ASSERT (tree);
	tree->m_parent = parent;
	tree->m_box[0] = minP - dgBigVector (hacd::HaF64 (1.0e-3f), hacd::HaF64 (1.0e-3f), hacd::HaF64 (1.0e-3f), hacd::HaF64 (1.0f));
	tree->m_box[1] = maxP + dgBigVector (hacd::HaF64 (1.0e-3f), hacd::HaF64 (1.0e-3f), hacd::HaF64 (1.0e-3f), hacd::HaF64 (1.0f));
	return tree;
}